

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestCaseTracking::NameAndLocation::NameAndLocation
          (NameAndLocation *this,string *_name,SourceLineInfo *_location)

{
  size_t sVar1;
  
  std::__cxx11::string::string((string *)this,_name);
  sVar1 = _location->line;
  (this->location).file = _location->file;
  (this->location).line = sVar1;
  return;
}

Assistant:

NameAndLocation::NameAndLocation( std::string const& _name, SourceLineInfo const& _location )
    :   name( _name ),
        location( _location )
    {}